

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O2

int64_t __thiscall absl::lts_20250127::ToUnixMillis(lts_20250127 *this,Time t)

{
  int64_t iVar1;
  Duration d;
  
  d.rep_lo_ = t.rep_.rep_hi_.lo_;
  if ((ulong)this >> 0x35 == 0) {
    return ((ulong)t.rep_.rep_hi_ & 0xffffffff) / 4000000 + (long)this * 1000;
  }
  d.rep_hi_ = (HiRep)this;
  iVar1 = anon_unknown_8::FloorToUnit(d,(Duration)(ZEXT412(4000000) << 0x40));
  return iVar1;
}

Assistant:

int64_t ToUnixMillis(Time t) {
  if (time_internal::GetRepHi(time_internal::ToUnixDuration(t)) >= 0 &&
      time_internal::GetRepHi(time_internal::ToUnixDuration(t)) >> 53 == 0) {
    return (time_internal::GetRepHi(time_internal::ToUnixDuration(t)) * 1000) +
           (time_internal::GetRepLo(time_internal::ToUnixDuration(t)) /
            (4000 * 1000));
  }
  return FloorToUnit(time_internal::ToUnixDuration(t), absl::Milliseconds(1));
}